

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O3

void __thiscall BaseNode::RenderSlot(BaseNode *this,char *slot_title,int kind)

{
  ImVec2 *pIVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  float fVar7;
  bool bVar8;
  ImU32 col;
  ImGuiID id;
  ImGuiStyle *pIVar9;
  ImDrawList *this_00;
  uint uVar10;
  float fVar11;
  float fVar12;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar13;
  ImColor color;
  ImRect circle_rect;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  ImVec2 local_80;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImRect local_40;
  
  pIVar9 = ImGui::GetStyle();
  fVar11 = gCanvas->zoom;
  IVar4 = ImGui::CalcTextSize(slot_title,(char *)0x0,false,-1.0);
  fVar13 = (pIVar9->ItemSpacing).x * gCanvas->zoom;
  if (kind < 1) {
    fVar13 = -fVar13;
  }
  IVar5 = ImGui::GetCursorScreenPos();
  local_78._4_4_ = IVar5.y + 0.0;
  local_78._0_4_ = fVar13 + IVar5.x;
  ImGui::SetCursorScreenPos((ImVec2 *)local_78);
  bVar8 = ImNodes::BeginSlot(slot_title,kind);
  if (bVar8) {
    this_00 = ImGui::GetWindowDrawList();
    uVar10 = 5;
    bVar8 = ImNodes::IsSlotCurveHovered();
    if (!bVar8) {
      uVar10 = 4;
      bVar8 = ImNodes::IsConnectingCompatibleSlot();
      if (bVar8) {
        bVar8 = IsAlreadyConnectedWithPendingConnection(this,slot_title,kind);
        uVar10 = bVar8 ^ 5;
      }
    }
    fVar11 = fVar11 * 5.0;
    pIVar1 = (ImVec2 *)((long)&gCanvas->colors[0].Value.x + (ulong)(uVar10 << 4));
    local_78._0_8_ = *pIVar1;
    local_78._8_8_ = pIVar1[1];
    ImGui::PushStyleColor(0,(ImVec4 *)local_78);
    if (0 < kind) {
      local_a8 = IVar4.x;
      uVar10 = -(uint)(local_a8 <= this->output_max_title_width);
      fVar7 = (float)(~uVar10 & (uint)local_a8 | (uint)this->output_max_title_width & uVar10);
      this->output_max_title_width = fVar7;
      fVar2 = (pIVar9->ItemSpacing).x;
      fVar12 = ImGui::GetCursorPosX();
      ImGui::SetCursorPosX(fVar12 + ((fVar7 + fVar2) - local_a8));
      ImGui::TextUnformatted(slot_title,(char *)0x0);
      ImGui::SameLine(0.0,-1.0);
    }
    IVar5 = ImGui::GetCursorScreenPos();
    IVar6 = ImGui::GetCursorScreenPos();
    fStack_5c = fVar11 + fVar11;
    local_68 = fStack_5c + IVar6.x;
    fStack_64 = fStack_5c + IVar6.y;
    fStack_60 = fStack_5c + extraout_XMM0_Dc;
    fStack_5c = fStack_5c + extraout_XMM0_Dd;
    local_b8 = IVar5.x;
    fStack_b4 = IVar5.y;
    local_40.Min.x = local_b8;
    fStack_a4 = IVar4.y;
    local_58 = fStack_a4 * 0.5 - fVar11;
    fStack_b4 = fStack_b4 + local_58;
    local_58 = fStack_64 + local_58;
    local_80.y = (local_58 + fStack_b4) * 0.5;
    local_80.x = (local_68 + local_b8) * 0.5;
    fStack_54 = fStack_64;
    fStack_50 = fStack_64;
    fStack_4c = fStack_64;
    local_40.Min.y = fStack_b4;
    local_40.Max.x = local_68;
    local_40.Max.y = local_58;
    col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_78);
    ImDrawList::AddCircleFilled(this_00,&local_80,fVar11,col,0xc);
    local_80.y = local_58 - fStack_b4;
    local_80.x = local_68 - local_b8;
    ImGui::ItemSize(&local_80,0.0);
    id = ImGui::GetID(this->title);
    ImGui::ItemAdd(&local_40,id,(ImRect *)0x0);
    if (kind < 0) {
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextUnformatted(slot_title,(char *)0x0);
    }
    ImGui::PopStyleColor(1);
    ImNodes::EndSlot();
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    (pIVar3->DC).CursorMaxPos.x = (pIVar3->DC).CursorMaxPos.x - fVar13;
  }
  return;
}

Assistant:

void RenderSlot(const char* slot_title, int kind)
    {
        const auto& style = ImGui::GetStyle();
        const float CIRCLE_RADIUS = 5.f * gCanvas->zoom;
        ImVec2 title_size = ImGui::CalcTextSize(slot_title);
        // Pull entire slot a little bit out of the edge so that curves connect into int without visible seams
        float item_offset_x = style.ItemSpacing.x * gCanvas->zoom;
        if (!ImNodes::IsOutputSlotKind(kind))
            item_offset_x = -item_offset_x;
        ImGui::SetCursorScreenPos(ImGui::GetCursorScreenPos() + ImVec2{item_offset_x, 0});

        if (ImNodes::BeginSlot(slot_title, kind))
        {
            auto* draw_lists = ImGui::GetWindowDrawList();

            // Slot appearance can be altered depending on curve hovering state.
            bool is_active = ImNodes::IsSlotCurveHovered() ||
                (ImNodes::IsConnectingCompatibleSlot() && !IsAlreadyConnectedWithPendingConnection(slot_title, kind));

            ImColor color = gCanvas->colors[is_active ? ImNodes::ColConnectionActive : ImNodes::ColConnection];

            ImGui::PushStyleColor(ImGuiCol_Text, color.Value);

            if (ImNodes::IsOutputSlotKind(kind))
            {
                // Align output slots to the right edge of the node.
                output_max_title_width = ImMax(output_max_title_width, title_size.x);
                float offset = (output_max_title_width + style.ItemSpacing.x) - title_size.x;
                ImGui::SetCursorPosX(ImGui::GetCursorPosX() + offset);

                ImGui::TextUnformatted(slot_title);
                ImGui::SameLine();
            }

            ImRect circle_rect{
                ImGui::GetCursorScreenPos(),
                ImGui::GetCursorScreenPos() + ImVec2{CIRCLE_RADIUS * 2, CIRCLE_RADIUS * 2}
            };
            // Vertical-align circle in the middle of the line.
            float circle_offset_y = title_size.y / 2.f - CIRCLE_RADIUS;
            circle_rect.Min.y += circle_offset_y;
            circle_rect.Max.y += circle_offset_y;
            draw_lists->AddCircleFilled(circle_rect.GetCenter(), CIRCLE_RADIUS, color);

            ImGui::ItemSize(circle_rect.GetSize());
            ImGui::ItemAdd(circle_rect, ImGui::GetID(title));

            if (ImNodes::IsInputSlotKind(kind))
            {
                ImGui::SameLine();
                ImGui::TextUnformatted(slot_title);
            }

            ImGui::PopStyleColor();
            ImNodes::EndSlot();

            // A dirty trick to place output slot circle on the border.
            ImGui::GetCurrentWindow()->DC.CursorMaxPos.x -= item_offset_x;
        }
    }